

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

group * __thiscall
clipp::group::depth_first_traverser::innermost_repeat_group(depth_first_traverser *this)

{
  group *pgVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
  i;
  pointer local_20;
  pointer local_18;
  pointer local_10;
  
  local_18 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_10 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::depth_first_traverser::innermost_repeat_group()const::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>>
            (&local_20);
  if (local_20 ==
      (this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pgVar1 = (group *)0x0;
  }
  else {
    pgVar1 = local_20[-1].parent;
  }
  return pgVar1;
}

Assistant:

const group*
        innermost_repeat_group() const noexcept {
            auto i = std::find_if(stack_.rbegin(), stack_.rend(),
                [](const context& c) { return c.parent->repeatable(); });
            return i != stack_.rend() ? i->parent : nullptr;
        }